

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O0

int Map_SuperTableInsert(Map_HashTable_t *p,uint *uTruth,Map_Super_t *pGate,uint uPhase)

{
  Map_HashEntry_t *__s;
  uint uVar1;
  Map_HashEntry_t *pMStack_38;
  uint Key;
  Map_HashEntry_t *pEnt;
  uint uPhase_local;
  Map_Super_t *pGate_local;
  uint *uTruth_local;
  Map_HashTable_t *p_local;
  
  if (SBORROW4(p->nEntries,p->nBins * 2) == p->nEntries + p->nBins * -2 < 0) {
    Map_SuperTableResize(p);
  }
  uVar1 = (*uTruth + uTruth[1] * 0x7d3) % (uint)p->nBins;
  pMStack_38 = p->pBins[uVar1];
  while( true ) {
    if (pMStack_38 == (Map_HashEntry_t *)0x0) {
      __s = (Map_HashEntry_t *)Extra_MmFixedEntryFetch(p->mmMan);
      memset(__s,0,0x20);
      __s->uTruth[0] = *uTruth;
      __s->uTruth[1] = uTruth[1];
      __s->pGates = pGate;
      __s->uPhase = uPhase;
      __s->pNext = p->pBins[uVar1];
      p->pBins[uVar1] = __s;
      p->nEntries = p->nEntries + 1;
      return 0;
    }
    if ((pMStack_38->uTruth[0] == *uTruth) && (pMStack_38->uTruth[1] == uTruth[1])) break;
    pMStack_38 = pMStack_38->pNext;
  }
  return 1;
}

Assistant:

int Map_SuperTableInsert( Map_HashTable_t * p, unsigned uTruth[], Map_Super_t * pGate, unsigned uPhase )
{
    Map_HashEntry_t * pEnt;
    unsigned Key;
    // resize the table
    if ( p->nEntries >= 2 * p->nBins )
        Map_SuperTableResize( p );
    // check if this entry already exists
    Key = MAP_TABLE_HASH( uTruth[0], uTruth[1], p->nBins );
    for ( pEnt = p->pBins[Key]; pEnt; pEnt = pEnt->pNext )
        if ( pEnt->uTruth[0] == uTruth[0] && pEnt->uTruth[1] == uTruth[1] )
            return 1;
    // add the new hash table entry to the table
    pEnt = (Map_HashEntry_t *)Extra_MmFixedEntryFetch( p->mmMan );
    memset( pEnt, 0, sizeof(Map_HashEntry_t) );
    pEnt->uTruth[0] = uTruth[0];
    pEnt->uTruth[1] = uTruth[1];
    pEnt->pGates    = pGate;
    pEnt->uPhase    = uPhase;
    // add the hash table to the corresponding linked list in the table
    pEnt->pNext   = p->pBins[Key];
    p->pBins[Key] = pEnt;
    p->nEntries++;
/*
printf( "Adding gate: %10u ", Key );
Map_LibraryPrintSupergate( pGate );
Extra_PrintBinary( stdout, uTruth, 32 );
printf( "\n" );
*/
    return 0;
}